

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retArea.c
# Opt level: O3

Abc_Obj_t * Abc_NtkRetimeMinAreaConstructNtk_rec(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  uint uVar5;
  Abc_Obj_t *pAVar6;
  int in_EDX;
  int Fill;
  long lVar7;
  
  pAVar3 = pObj->pNtk;
  iVar1 = pObj->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar1 + 1,in_EDX);
  if (((long)iVar1 < 0) || ((pAVar3->vTravIds).nSize <= iVar1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar4 = pObj->pNtk;
  iVar2 = pAVar4->nTravIds;
  if ((pAVar3->vTravIds).pArray[iVar1] != iVar2) {
    iVar1 = pObj->Id;
    Vec_IntFillExtra(&pAVar4->vTravIds,iVar1 + 1,Fill);
    if (((long)iVar1 < 0) || ((pAVar4->vTravIds).nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (pAVar4->vTravIds).pArray[iVar1] = iVar2;
    uVar5 = *(uint *)&pObj->field_0x14 & 0xf;
    if (uVar5 == 4) {
      pAVar6 = Abc_NtkRetimeMinAreaConstructNtk_rec
                         (pNtkNew,(Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray]);
      (pObj->field_6).pCopy = pAVar6;
      return pAVar6;
    }
    if (uVar5 != 7) {
      __assert_fail("Abc_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/ret/retArea.c"
                    ,0x157,
                    "Abc_Obj_t *Abc_NtkRetimeMinAreaConstructNtk_rec(Abc_Ntk_t *, Abc_Obj_t *)");
    }
    if (0 < (pObj->vFanins).nSize) {
      lVar7 = 0;
      do {
        Abc_NtkRetimeMinAreaConstructNtk_rec
                  (pNtkNew,(Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar7]]);
        lVar7 = lVar7 + 1;
      } while (lVar7 < (pObj->vFanins).nSize);
    }
    Abc_NtkDupObj(pNtkNew,pObj,0);
    if (0 < (pObj->vFanins).nSize) {
      lVar7 = 0;
      do {
        Abc_ObjAddFanin((pObj->field_6).pCopy,
                        *(Abc_Obj_t **)
                         ((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar7]] + 0x40));
        lVar7 = lVar7 + 1;
      } while (lVar7 < (pObj->vFanins).nSize);
    }
  }
  return (Abc_Obj_t *)(pObj->field_6).pTemp;
}

Assistant:

Abc_Obj_t * Abc_NtkRetimeMinAreaConstructNtk_rec( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin;
    int i;
    // skip visited nodes
    if ( Abc_NodeIsTravIdCurrent(pObj) )
        return pObj->pCopy;
    Abc_NodeSetTravIdCurrent(pObj);
    // consider the case of a latch output
    if ( Abc_ObjIsBi(pObj) )
    {
        pObj->pCopy = Abc_NtkRetimeMinAreaConstructNtk_rec( pNtkNew, Abc_ObjFanin0(pObj) );
        return pObj->pCopy;
    }
    assert( Abc_ObjIsNode(pObj) );
    // visit the fanins
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Abc_NtkRetimeMinAreaConstructNtk_rec( pNtkNew, pFanin );
    // compute the value of the node
    Abc_NtkDupObj( pNtkNew, pObj, 0 );
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
    return pObj->pCopy;
}